

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

char * nifti_datatype_to_string(int dtype)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = 0x2b;
  do {
    uVar3 = uVar1 - 1;
    if (nifti_type_list[uVar3].type == dtype) {
      iVar2 = uVar1 - 1;
      goto LAB_00115755;
    }
    uVar1 = uVar3;
  } while (1 < uVar3);
  iVar2 = 0;
LAB_00115755:
  return nifti_type_list[iVar2].name;
}

Assistant:

const char * nifti_datatype_to_string( int dtype )
{
    int tablen = sizeof(nifti_type_list)/sizeof(nifti_type_ele);
    int c;

    for( c = tablen-1; c > 0; c-- )
        if( nifti_type_list[c].type == dtype )
            break;

    return nifti_type_list[c].name;
}